

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O1

void __thiscall OSTEI_VRR_Writer::WriteVRR_General_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  OSTEI_VRR_Algorithm_Base *pOVar3;
  pointer pcVar4;
  pointer pbVar5;
  QAM *tam;
  bool bVar6;
  RRStepType RVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  ostream *poVar11;
  pointer pbVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  char *pcVar13;
  _Alloc_hider _Var14;
  pointer tam_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  amreq_str;
  string stepstr;
  QAMList amreq;
  StringSet varreq;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  OSTEI_VRR_Writer *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  RRStepType local_1d4;
  QAM *local_1d0;
  ostream *local_1c8;
  string local_1c0;
  QAMList local_1a0;
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  char local_168 [16];
  undefined1 local_158 [16];
  _Alloc_hider local_148;
  char local_138 [16];
  undefined1 local_128 [16];
  _Alloc_hider local_118;
  char local_108 [16];
  undefined1 local_f8 [16];
  _Alloc_hider local_e8;
  char local_d8 [16];
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  pOVar3 = this->vrr_algo_;
  local_98._0_8_ = *(undefined8 *)(am->qam)._M_elems;
  local_98._8_8_ = *(undefined8 *)((am->qam)._M_elems + 2);
  pcVar4 = (am->tag)._M_dataplus._M_p;
  local_220 = this;
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar4,pcVar4 + (am->tag)._M_string_length);
  RVar7 = OSTEI_VRR_Algorithm_Base::GetRRStep(pOVar3,(QAM *)local_98);
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  RRStepTypeToStr_abi_cxx11_(&local_1c0,RVar7);
  pOVar3 = local_220->vrr_algo_;
  local_c8._0_8_ = *(undefined8 *)(am->qam)._M_elems;
  local_c8._8_8_ = *(undefined8 *)((am->qam)._M_elems + 2);
  pcVar4 = (am->tag)._M_dataplus._M_p;
  local_b8._M_p = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar4,pcVar4 + (am->tag)._M_string_length);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_((StringSet *)&local_60,pOVar3,(QAM *)local_c8);
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  pOVar3 = local_220->vrr_algo_;
  local_f8._0_8_ = *(undefined8 *)(am->qam)._M_elems;
  local_f8._8_8_ = *(undefined8 *)((am->qam)._M_elems + 2);
  pcVar4 = (am->tag)._M_dataplus._M_p;
  local_e8._M_p = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar4,pcVar4 + (am->tag)._M_string_length);
  OSTEI_VRR_Algorithm_Base::GenerateAMReq(&local_1a0,pOVar3,(QAM *)local_f8,RVar7,true);
  local_1d4 = RVar7;
  local_1d0 = am;
  local_1c8 = os;
  if (local_e8._M_p != local_d8) {
    operator_delete(local_e8._M_p);
  }
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1a0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_1a0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    paVar1 = &local_218.field_2;
    tam_00 = local_1a0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      local_188._0_8_ = *(undefined8 *)(tam_00->qam)._M_elems;
      local_188._8_8_ = *(undefined8 *)((tam_00->qam)._M_elems + 2);
      pcVar4 = (tam_00->tag)._M_dataplus._M_p;
      local_178._M_p = local_168;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pcVar4,pcVar4 + (tam_00->tag)._M_string_length);
      bVar6 = ValidQAM((QAM *)local_188);
      if (local_178._M_p != local_168) {
        operator_delete(local_178._M_p);
      }
      local_218._M_dataplus._M_p = (pointer)paVar1;
      if (bVar6) {
        local_218.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_218._M_string_length = 4;
        local_218.field_2._M_local_buf[4] = '\0';
        ArrVarName(&local_1f8,tam_00,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar1) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
                   &local_1f8);
        _Var14._M_p = local_1f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
LAB_0011b486:
          operator_delete(_Var14._M_p);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"NULL","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
                   &local_218);
        _Var14._M_p = local_218._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar1) goto LAB_0011b486;
      }
      tam_00 = tam_00 + 1;
    } while (tam_00 != local_1a0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  poVar11 = local_1c8;
  tam = local_1d0;
  RVar7 = local_1d4;
  lVar9 = 0;
  lVar15 = 0;
  lVar16 = 0;
  do {
    uVar2 = *(undefined8 *)((local_1d0->qam)._M_elems + lVar9);
    iVar8 = (int)((ulong)uVar2 >> 0x20);
    auVar17._0_4_ = -(uint)((int)uVar2 == 0);
    auVar17._4_4_ = -(uint)(iVar8 == 0);
    auVar17._8_4_ = -(uint)(iVar8 == 0);
    auVar17._12_4_ = 0xffffffff;
    lVar15 = lVar15 + SUB168(auVar17 & _DAT_00149aa0,0);
    lVar16 = lVar16 + SUB168(auVar17 & _DAT_00149aa0,8);
    lVar9 = lVar9 + 2;
  } while (lVar9 != 4);
  if (lVar16 + lVar15 != 3) {
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1c8,indent5_abi_cxx11_._M_dataplus._M_p,
                         indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ostei_general_vrr_",0x12);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,(tam->qam)._M_elems[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,(tam->qam)._M_elems[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,(tam->qam)._M_elems[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,(tam->qam)._M_elems[3]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    pOVar3 = local_220->vrr_algo_;
    local_158._0_8_ = *(undefined8 *)(tam->qam)._M_elems;
    local_158._8_8_ = *(undefined8 *)((tam->qam)._M_elems + 2);
    pcVar4 = (tam->tag)._M_dataplus._M_p;
    local_148._M_p = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,pcVar4,pcVar4 + (tam->tag)._M_string_length);
    iVar8 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar3,(QAM *)local_158);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar8 + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,indent7_abi_cxx11_._M_dataplus._M_p,indent7_abi_cxx11_._M_string_length);
    if (local_148._M_p != local_138) {
      operator_delete(local_148._M_p);
    }
    pcVar13 = "one_over_2q, a_over_q, one_over_2pq, aoq_PQ, ";
    if (RVar7 < K) {
      pcVar13 = "one_over_2p, a_over_p, one_over_2pq, aop_PQ, ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,0x2d);
    switch(RVar7) {
    case I:
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"P_PA,\n",6);
      if (RVar7 == L) goto switchD_0011b840_caseD_3;
      if (RVar7 == K) goto switchD_0011b840_caseD_2;
      if (RVar7 == J) goto switchD_0011b840_caseD_1;
      break;
    case J:
switchD_0011b840_caseD_1:
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"P_PB,\n",6);
      if (RVar7 == L) goto switchD_0011b840_caseD_3;
      if (RVar7 == K) goto switchD_0011b840_caseD_2;
      break;
    case K:
switchD_0011b840_caseD_2:
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Q_PA,\n",6);
      if (RVar7 == L) goto switchD_0011b840_caseD_3;
      break;
    case L:
switchD_0011b840_caseD_3:
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Q_PB,\n",6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,indent7_abi_cxx11_._M_dataplus._M_p,indent7_abi_cxx11_._M_string_length);
    pbVar5 = local_238.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar12 = local_238.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar5;
        pbVar12 = pbVar12 + 1) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    }
    local_218.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
    local_218._M_string_length = 4;
    local_218.field_2._M_local_buf[4] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ArrVarName(&local_1f8,tam,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,");\n",3);
    goto LAB_0011bb0d;
  }
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_1c8,indent5_abi_cxx11_._M_dataplus._M_p,
                       indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ostei_general_vrr1_",0x13);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,(tam->qam)._M_elems[(int)RVar7]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  pOVar3 = local_220->vrr_algo_;
  local_128._0_8_ = *(undefined8 *)(tam->qam)._M_elems;
  local_128._8_8_ = *(undefined8 *)((tam->qam)._M_elems + 2);
  pcVar4 = (tam->tag)._M_dataplus._M_p;
  local_118._M_p = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar4,pcVar4 + (tam->tag)._M_string_length);
  iVar8 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar3,(QAM *)local_128);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar8 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,indent7_abi_cxx11_._M_dataplus._M_p,indent7_abi_cxx11_._M_string_length);
  if (local_118._M_p != local_108) {
    operator_delete(local_118._M_p);
  }
  pcVar13 = "one_over_2q, a_over_q, aoq_PQ, ";
  if (RVar7 < K) {
    pcVar13 = "one_over_2p, a_over_p, aop_PQ, ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,0x1f);
  switch(RVar7) {
  case I:
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"P_PA,\n",6);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,indent7_abi_cxx11_._M_dataplus._M_p,
                         indent7_abi_cxx11_._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,((local_238.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         (local_238.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    break;
  case J:
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"P_PB,\n",6);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,indent7_abi_cxx11_._M_dataplus._M_p,
                         indent7_abi_cxx11_._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,((local_238.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         (local_238.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    goto LAB_0011ba7b;
  case K:
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Q_PA,\n",6);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,indent7_abi_cxx11_._M_dataplus._M_p,
                         indent7_abi_cxx11_._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,((local_238.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         (local_238.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    break;
  case L:
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Q_PB,\n",6);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,indent7_abi_cxx11_._M_dataplus._M_p,
                         indent7_abi_cxx11_._M_string_length);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,((local_238.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         (local_238.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
LAB_0011ba7b:
    pbVar12 = local_238.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
    pbVar5 = local_238.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    goto LAB_0011ba87;
  default:
    goto switchD_0011b640_default;
  }
  pbVar12 = local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
  pbVar5 = local_238.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_0011ba87:
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(pbVar12->_M_dataplus)._M_p,pbVar5->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
switchD_0011b640_default:
  local_218.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
  local_218._M_string_length = 4;
  local_218.field_2._M_local_buf[4] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  ArrVarName(&local_1f8,tam,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,");\n",3);
LAB_0011bb0d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_1a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_General_(std::ostream & os, QAM am) const
{
    // is this a special case (incrementing with all other AM == 0)?
    RRStepType rrstep = vrr_algo_.GetRRStep(am);
    std::string stepstr = RRStepTypeToStr(rrstep);
    auto varreq = vrr_algo_.GetVarReq(am);

    auto amreq = vrr_algo_.GenerateAMReq(am, rrstep, true);
    std::vector<std::string> amreq_str;
    for(const auto &it : amreq)
    {
        if(!ValidQAM(it))
            amreq_str.push_back("NULL");
        else
            amreq_str.push_back(PrimVarName(it));
    }
    

    if(std::count(am.begin(), am.end(), 0) == 3)
    {
        os << indent5 << "ostei_general_vrr1_" << stepstr << "("
                      << am[static_cast<int>(rrstep)] << ", " << (vrr_algo_.GetMReq(am)+1) << ",\n"
           << indent7;

        if(rrstep == RRStepType::I || rrstep == RRStepType::J)
            os << "one_over_2p, a_over_p, aop_PQ, ";
        else
            os << "one_over_2q, a_over_q, aoq_PQ, ";

        switch(rrstep)
        {
            case RRStepType::I:
                os << "P_PA,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[1] << ", ";
                break;
        
            case RRStepType::J:
                os << "P_PB,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[2] << ", ";
                break;

            case RRStepType::K:
                os << "Q_PA,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[1] << ", ";
                break;

            case RRStepType::L:
                os << "Q_PB,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[2] << ", ";
                break;
        }

        os << PrimVarName(am) << ");\n"; // output array

    }
    else
    {
        os << indent5 << "ostei_general_vrr_" << stepstr << "("
                      << am[0] << ", " << am[1] << ", " << am[2] << ", " << am[3] << ", " << (vrr_algo_.GetMReq(am)+1) << ",\n"
           << indent7;

        if(rrstep == RRStepType::I || rrstep == RRStepType::J)
            os << "one_over_2p, a_over_p, one_over_2pq, aop_PQ, ";
        else
            os << "one_over_2q, a_over_q, one_over_2pq, aoq_PQ, ";


        if(rrstep == RRStepType::I)
            os << "P_PA,\n";
        if(rrstep == RRStepType::J)
            os << "P_PB,\n";
        if(rrstep == RRStepType::K)
            os << "Q_PA,\n";
        if(rrstep == RRStepType::L)
            os << "Q_PB,\n";

        os << indent7;
        for(const auto &it : amreq_str)
            os << it << ", ";

        os << PrimVarName(am) << ");\n";
    }
}